

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitSwitch(PrintExpressionContents *this,Switch *curr)

{
  ArenaVector<wasm::Name> *pAVar1;
  Name *this_00;
  string_view str;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  str._M_str = "br_table";
  str._M_len = 8;
  printMedium(this->o,str);
  __begin2.parent = (ArenaVector<wasm::Name> *)0x0;
  pAVar1 = (ArenaVector<wasm::Name> *)
           (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
  local_40 = (undefined1  [8])&curr->targets;
  while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])&curr->targets))) {
    this_00 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                        ((Iterator *)local_40);
    std::operator<<(this->o,' ');
    Name::print(this_00,this->o);
    __begin2.parent =
         (ArenaVector<wasm::Name> *)
         ((long)&((__begin2.parent)->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).
                 data + 1);
  }
  std::operator<<(this->o,' ');
  Name::print(&curr->default_,this->o);
  return;
}

Assistant:

void visitSwitch(Switch* curr) {
    printMedium(o, "br_table");
    for (auto& t : curr->targets) {
      o << ' ';
      t.print(o);
    }
    o << ' ';
    curr->default_.print(o);
  }